

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O1

void ewmh_update_desktop_names(natwm_state *state,workspace_list *list)

{
  void *__dest;
  int iVar1;
  char *__s;
  xcb_ewmh_connection_t *pxVar2;
  long lVar3;
  size_t __n;
  long lVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  undefined8 uStack_68;
  undefined8 uStack_60;
  size_t local_58;
  workspace **local_50;
  natwm_state *local_48;
  undefined1 *local_40;
  long local_38;
  
  uStack_60 = 0x108247;
  if (list->count != 0) {
    lVar3 = -(list->count * 0x33 + 0xf & 0xfffffffffffffff0);
    lVar4 = (long)&uStack_60 + lVar3;
    if (list->count == 0) {
      iVar6 = -1;
    }
    else {
      local_50 = list->workspaces;
      lVar7 = 0;
      sVar5 = 0;
      local_58 = list->count;
      local_48 = state;
      local_40 = (undefined1 *)&uStack_60;
      local_38 = lVar4;
      do {
        __s = local_50[sVar5]->name;
        *(undefined8 *)((long)&uStack_68 + lVar3) = 0x1082a8;
        __n = strlen(__s);
        __dest = (void *)(local_38 + lVar7);
        *(undefined8 *)((long)&uStack_68 + lVar3) = 0x1082c1;
        memcpy(__dest,__s,__n);
        *(undefined1 *)(__n + (long)__dest) = 0;
        lVar7 = lVar7 + __n + 1;
        sVar5 = sVar5 + 1;
      } while (local_58 != sVar5);
      iVar6 = (int)lVar7 + -1;
      lVar4 = local_38;
      state = local_48;
    }
    pxVar2 = state->ewmh;
    iVar1 = state->screen_num;
    *(undefined8 *)((long)&uStack_68 + lVar3) = 0x10831b;
    xcb_ewmh_set_desktop_names(pxVar2,iVar1,iVar6,lVar4);
    return;
  }
  xcb_ewmh_set_desktop_names(state->ewmh,state->screen_num,0,0);
  return;
}

Assistant:

void ewmh_update_desktop_names(const struct natwm_state *state, const struct workspace_list *list)
{
        // Should never happen
        if (list->count < 1) {
                xcb_ewmh_set_desktop_names(state->ewmh, state->screen_num, 0, NULL);

                return;
        }

        char names[(NATWM_WORKSPACE_NAME_MAX_LEN * list->count) + list->count];
        size_t pos = 0;

        for (size_t i = 0; i < list->count; ++i) {
                const char *name = list->workspaces[i]->name;
                size_t name_length = strlen(name);

                memcpy(names + pos, name, name_length);

                names[pos + name_length] = '\0';

                pos += (name_length + 1);
        }

        xcb_ewmh_set_desktop_names(state->ewmh, state->screen_num, (uint32_t)(pos - 1), names);
}